

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetBooleanVerifier::verifyFloatRange
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLfloat min,GLfloat max)

{
  ostringstream *poVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  StateQueryMemoryWriteGuard<unsigned_char[2]> range;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[2]>::
  StateQueryMemoryWriteGuard(&range);
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,range.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[2]>::verifyValidity
                    (&range,testCtx);
  if (bVar2) {
    if ((range.m_value[0] != '\0') || ((0.0 <= min && (0.0 <= max)))) {
      if (range.m_value[1] != '\0') {
        return;
      }
      if ((min <= 0.0) && (max <= 0.0)) {
        return;
      }
      local_1b0._0_8_ = testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"// ERROR: range [");
      std::ostream::operator<<(poVar1,min);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,max);
      std::operator<<((ostream *)poVar1,"] is not in range [");
      pcVar4 = "non-boolean";
      pcVar3 = "non-boolean";
      if (range.m_value[0] == '\0') {
        pcVar3 = "GL_FALSE";
      }
      if (range.m_value[0] == '\x01') {
        pcVar3 = "GL_TRUE";
      }
      std::operator<<((ostream *)poVar1,pcVar3);
      std::operator<<((ostream *)poVar1,", ");
      if (range.m_value[1] == '\0') {
        pcVar4 = "GL_FALSE";
      }
      if (range.m_value[1] == '\x01') {
        pcVar4 = "GL_TRUE";
      }
      std::operator<<((ostream *)poVar1,pcVar4);
      std::operator<<((ostream *)poVar1,"]");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1b0._0_8_ = testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"// ERROR: range [");
      std::ostream::operator<<(poVar1,min);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,max);
      std::operator<<((ostream *)poVar1,"] is not in range [");
      pcVar4 = "non-boolean";
      pcVar3 = "non-boolean";
      if (range.m_value[0] == '\0') {
        pcVar3 = "GL_FALSE";
      }
      if (range.m_value[0] == '\x01') {
        pcVar3 = "GL_TRUE";
      }
      std::operator<<((ostream *)poVar1,pcVar3);
      std::operator<<((ostream *)poVar1,", ");
      if (range.m_value[1] == '\0') {
        pcVar4 = "GL_FALSE";
      }
      if (range.m_value[1] == '\x01') {
        pcVar4 = "GL_TRUE";
      }
      std::operator<<((ostream *)poVar1,pcVar4);
      std::operator<<((ostream *)poVar1,"]");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean range");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyFloatRange (tcu::TestContext& testCtx, GLenum name, GLfloat min, GLfloat max)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean[2]> range;
	glGetBooleanv(name, range);

	if (!range.verifyValidity(testCtx))
		return;

	if (range[0] == GL_FALSE)
	{
		if (max < 0 || min < 0)
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: range [" << min << ", " << max << "] is not in range [" << (range[0] == GL_TRUE ? "GL_TRUE" : (range[0] == GL_FALSE ? "GL_FALSE" : "non-boolean")) << ", " << (range[1] == GL_TRUE ? "GL_TRUE" : (range[1] == GL_FALSE ? "GL_FALSE" : "non-boolean")) << "]"  << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean range");
			return;
		}
	}
	if (range[1] == GL_FALSE)
	{
		if (max > 0 || min > 0)
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: range [" << min << ", " << max << "] is not in range [" << (range[0] == GL_TRUE ? "GL_TRUE" : (range[0] == GL_FALSE ? "GL_FALSE" : "non-boolean")) << ", " << (range[1] == GL_TRUE ? "GL_TRUE" : (range[1] == GL_FALSE ? "GL_FALSE" : "non-boolean")) << "]"  << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean range");
			return;
		}
	}
}